

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprV128ConstExpr
          (BinaryReaderIR *this,Index index,v128 value)

{
  intrusive_list<wabt::Expr> *this_00;
  Result RVar1;
  Location *in_R8;
  v128 val;
  Const local_a8;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_60;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_58;
  undefined1 local_50 [8];
  Location loc;
  Index index_local;
  BinaryReaderIR *this_local;
  v128 value_local;
  
  value_local.v._0_8_ = value.v._8_8_;
  loc.field_1._12_4_ = index;
  GetLocation((Location *)local_50,this);
  this_00 = this->current_init_expr_;
  val.v._8_8_ = local_50;
  val.v[0] = value_local.v[0];
  val.v[1] = value_local.v[1];
  val.v[2] = value_local.v[2];
  val.v[3] = value_local.v[3];
  val.v[4] = value_local.v[4];
  val.v[5] = value_local.v[5];
  val.v[6] = value_local.v[6];
  val.v[7] = value_local.v[7];
  Const::V128(&local_a8,value.v._0_8_,val,in_R8);
  MakeUnique<wabt::ConstExpr,wabt::Const,wabt::Location&>
            ((wabt *)&local_60,&local_a8,(Location *)local_50);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_58,&local_60);
  intrusive_list<wabt::Expr>::push_back(this_00,&local_58);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_58);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_60);
  Result::Result((Result *)(value_local.v + 8),Ok);
  RVar1.enum_._0_1_ = value_local.v[8];
  RVar1.enum_._1_1_ = value_local.v[9];
  RVar1.enum_._2_1_ = value_local.v[10];
  RVar1.enum_._3_1_ = value_local.v[0xb];
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnInitExprV128ConstExpr(Index index, v128 value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::V128(value, loc), loc));
  return Result::Ok;
}